

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-common.h
# Opt level: O2

size_t aesgcm_decrypt(ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq,
                     void *aad,size_t aadlen)

{
  int iVar1;
  uint8_t iv [16];
  
  if (inlen < 0x10) {
    return 0xffffffffffffffff;
  }
  ptls_aead__build_iv(_ctx->algo,iv,(uint8_t *)&_ctx[6].do_encrypt_init,seq);
  iVar1 = cf_gcm_decrypt(&cf_aes,_ctx + 1,(uint8_t *)input,inlen - 0x10,(uint8_t *)aad,aadlen,iv,0xc
                         ,(uint8_t *)((long)input + (inlen - 0x10)),0x10,(uint8_t *)output);
  return -(ulong)(iVar1 != 0) | inlen - 0x10;
}

Assistant:

static inline size_t aesgcm_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                                    const void *aad, size_t aadlen)
{
    struct aesgcm_context_t *ctx = (struct aesgcm_context_t *)_ctx;
    uint8_t iv[PTLS_AES_BLOCK_SIZE];

    if (inlen < PTLS_AESGCM_TAG_SIZE)
        return SIZE_MAX;
    size_t tag_offset = inlen - PTLS_AESGCM_TAG_SIZE;

    ptls_aead__build_iv(ctx->super.algo, iv, ctx->static_iv, seq);
    if (cf_gcm_decrypt(&cf_aes, &ctx->aes, input, tag_offset, aad, aadlen, iv, PTLS_AESGCM_IV_SIZE, (uint8_t *)input + tag_offset,
                       PTLS_AESGCM_TAG_SIZE, output) != 0)
        return SIZE_MAX;

    return tag_offset;
}